

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec10.c
# Opt level: O3

int If_Dec10Perform(word *pF,int nVars,int fDerive)

{
  byte bVar1;
  uint v;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  word Mask;
  word *pwVar12;
  uint uVar13;
  uint v_00;
  int iVar14;
  uint v_01;
  uint uVar15;
  ulong uVar16;
  uint *puVar17;
  ulong uVar18;
  ulong uVar19;
  word *pwVar20;
  uint *puVar21;
  uint uVar22;
  int Var2Pla [10];
  int Pla2Var [10];
  word pCof1 [16];
  word pCof0 [16];
  int Count [210];
  int Masks [210];
  uint local_8a8 [12];
  uint local_878 [12];
  ulong local_848 [16];
  ulong local_7c8 [16];
  ulong local_748 [16];
  uint local_6c8 [212];
  uint local_378 [210];
  
  if (4 < nVars - 6U) {
    __assert_fail("nVars >= 6 && nVars <= 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                  ,0x184,"int If_Dec10Perform(word *, int, int)");
  }
  uVar4 = 1 << ((byte)(nVars - 6U) & 0x1f);
  if ((uint)nVars < 7) {
    uVar4 = 1;
  }
  uVar5 = 0;
  do {
    if (5 < uVar5) {
      bVar9 = (byte)(uVar5 - 6);
      uVar2 = 1 << (bVar9 & 0x1f);
      iVar10 = 2 << (bVar9 & 0x1f);
      uVar19 = 1;
      if (1 < (int)uVar2) {
        uVar19 = (ulong)uVar2;
      }
      pwVar20 = pF + (int)uVar2;
      iVar14 = 0;
      pwVar12 = pF;
      do {
        if (uVar5 - 6 != 0x1f) {
          uVar11 = 0;
          do {
            if (pwVar12[uVar11] != pwVar20[uVar11]) goto LAB_00393d76;
            uVar11 = uVar11 + 1;
          } while (uVar19 != uVar11);
        }
        iVar14 = iVar14 + iVar10;
        pwVar20 = pwVar20 + iVar10;
        pwVar12 = pwVar12 + iVar10;
      } while (iVar14 < (int)uVar4);
LAB_0039422b:
      __assert_fail("If_Dec10HasVar( pF, nVars, i )",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                    ,0x188,"int If_Dec10Perform(word *, int, int)");
    }
    uVar19 = 0;
    while ((pF[uVar19] & ~Truth6[uVar5]) ==
           (pF[uVar19] & Truth6[uVar5]) >> ((byte)(1 << ((byte)uVar5 & 0x1f)) & 0x3f)) {
      uVar19 = uVar19 + 1;
      if (uVar4 == uVar19) goto LAB_0039422b;
    }
LAB_00393d76:
    local_8a8[uVar5] = (uint)uVar5;
    local_878[uVar5] = (uint)uVar5;
    uVar5 = uVar5 + 1;
  } while (uVar5 != (uint)nVars);
  bVar9 = (byte)(nVars + -4);
  uVar19 = ~(-1L << ((byte)(1 << (bVar9 & 0x1f)) & 0x3f));
  uVar5 = 0xffffffffffffffff;
  if (nVars != 10) {
    uVar5 = uVar19;
  }
  uVar11 = 0;
  uVar4 = 0;
  do {
    uVar2 = uVar4 + 1;
    if ((int)uVar2 < nVars) {
      v_01 = uVar2;
      do {
        uVar15 = v_01 + 1;
        if ((int)uVar15 < nVars) {
          v = uVar15;
          do {
            uVar13 = v + 1;
            if (nVars <= (int)uVar13) break;
            uVar11 = (ulong)(int)uVar11;
            v_00 = uVar13;
            do {
              If_Dec10MoveTo(pF,nVars,uVar4,nVars + -1,(int *)local_878,(int *)local_8a8);
              If_Dec10MoveTo(pF,nVars,v_01,nVars + -2,(int *)local_878,(int *)local_8a8);
              If_Dec10MoveTo(pF,nVars,v,nVars + -3,(int *)local_878,(int *)local_8a8);
              If_Dec10MoveTo(pF,nVars,v_00,nVars + -4,(int *)local_878,(int *)local_8a8);
              uVar6 = 0;
              do {
                if (uVar6 != local_878[(int)local_8a8[uVar6]]) {
                  __assert_fail("Pla2Var[Var2Pla[i]] == i",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                                ,0x17c,"void If_DecVerifyPerm(int *, int *, int)");
                }
                uVar6 = uVar6 + 1;
              } while ((uint)nVars != uVar6);
              local_748[0] = *pF & uVar5;
              uVar22 = 1;
              iVar10 = 1;
              do {
                bVar1 = bVar9 & 0x1f;
                uVar6 = pF[(uint)(iVar10 << bVar1) >> 6] >> ((byte)(iVar10 << bVar1) & 0x3f) & uVar5
                ;
                if ((int)uVar22 < 1) {
                  uVar7 = (ulong)(uint)(0 << bVar1);
LAB_00393f3b:
                  if ((uint)uVar7 == uVar22) goto LAB_00393f40;
                }
                else {
                  uVar7 = (ulong)(uint)(0 << bVar1);
                  do {
                    if (uVar6 == local_748[uVar7]) goto LAB_00393f3b;
                    uVar7 = uVar7 + 1;
                  } while (uVar22 != uVar7);
LAB_00393f40:
                  lVar8 = (long)(int)uVar22;
                  uVar22 = uVar22 + 1;
                  local_748[lVar8] = uVar6;
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 != 0x10);
              local_6c8[uVar11] = uVar22;
              local_378[uVar11] =
                   1 << ((byte)uVar4 & 0x1f) | 1 << (v_01 & 0x1f) | 1 << (v & 0x1f) |
                   1 << (v_00 & 0x1f);
              if ((int)uVar22 < 2) {
                __assert_fail("Count[v] > 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                              ,0x1a5,"int If_Dec10Perform(word *, int, int)");
              }
              if (uVar22 < 6 && uVar22 != 2) {
                iVar10 = 0;
                do {
                  If_Dec10Cofactors(pF,nVars,(nVars + -1) - iVar10,local_7c8,local_848);
                  if (nVars < 7) {
                    __assert_fail("nVars > 6 && nVars <= 10",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                                  ,0x9d,"int If_Dec10CofCount2(word *, int)");
                  }
                  uVar7 = local_7c8[0] & uVar19;
                  iVar14 = 1;
                  uVar6 = uVar7;
                  do {
                    uVar3 = iVar14 << (bVar9 & 0x1f);
                    uVar18 = local_7c8[uVar3 >> 6] >> ((byte)uVar3 & 0x3f) & uVar5;
                    uVar16 = uVar6;
                    if (((uVar18 != uVar7) && (uVar16 = uVar18, uVar6 != uVar7)) &&
                       (uVar16 = uVar6, uVar18 != uVar6)) goto LAB_00394067;
                    iVar14 = iVar14 + 1;
                    uVar6 = uVar16;
                  } while (iVar14 != 0x10);
                  uVar7 = local_848[0] & uVar19;
                  iVar14 = 1;
                  uVar6 = uVar7;
                  while (((uVar3 = iVar14 << (bVar9 & 0x1f),
                          uVar18 = local_848[uVar3 >> 6] >> ((byte)uVar3 & 0x3f) & uVar5,
                          uVar16 = uVar6, uVar18 == uVar7 || (uVar16 = uVar18, uVar6 == uVar7)) ||
                         (uVar16 = uVar6, uVar18 == uVar6))) {
                    iVar14 = iVar14 + 1;
                    uVar6 = uVar16;
                    if (iVar14 == 0x10) {
                      local_6c8[uVar11] = -uVar22;
                      goto LAB_0039408d;
                    }
                  }
LAB_00394067:
                  iVar10 = iVar10 + 1;
                } while (iVar10 != 4);
              }
LAB_0039408d:
              v_00 = v_00 + 1;
              uVar11 = uVar11 + 1;
            } while ((int)v_00 < nVars);
            v = uVar13;
          } while ((int)uVar13 < nVars);
        }
        v_01 = uVar15;
      } while (uVar15 != nVars);
    }
    uVar4 = uVar2;
  } while (uVar2 != nVars);
  if (0xd2 < (int)uVar11) {
    __assert_fail("v <= 210",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                  ,0x1b4,"int If_Dec10Perform(word *, int, int)");
  }
  if (0 < (int)uVar11) {
    uVar11 = uVar11 & 0xffffffff;
    puVar21 = local_6c8;
    puVar17 = local_378;
    uVar5 = uVar11;
    uVar19 = 0;
    do {
      uVar6 = uVar19 + 1;
      if (uVar6 < uVar11) {
        uVar7 = 1;
        do {
          uVar4 = puVar17[uVar7] & local_378[uVar19];
          if (0xfffe < (int)uVar4) {
            __assert_fail("Num16 < (1<<16)-1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                          ,0x175,"int If_Dec10Count16(int)");
          }
          if (BitCount8[uVar4 >> 8 & 0xff] + BitCount8[uVar4 & 0xff] <= 10 - nVars) {
            uVar4 = local_6c8[uVar19];
            if (nVars == 9) {
              if (uVar4 == 2) {
LAB_00394183:
                if (puVar21[uVar7] == 2) {
                  return 1;
                }
                if ((int)puVar21[uVar7] < 0) {
                  return 1;
                }
              }
              else if ((int)uVar4 < 0) goto LAB_00394171;
            }
            else if (nVars == 10) {
              if (uVar4 == 2) {
LAB_00394171:
                if (puVar21[uVar7] == 2) {
                  return 1;
                }
              }
            }
            else if ((uVar4 == 2) || ((int)uVar4 < 0)) goto LAB_00394183;
          }
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      puVar21 = puVar21 + 1;
      puVar17 = puVar17 + 1;
      uVar5 = uVar5 - 1;
      uVar19 = uVar6;
    } while (uVar6 != uVar11);
  }
  return 0;
}

Assistant:

int If_Dec10Perform( word * pF, int nVars, int fDerive )
{ 
//    static int Cnt = 0;
    word pCof0[16], pCof1[16];
    int Pla2Var[10], Var2Pla[10], Count[210], Masks[210];
    int i, i0,i1,i2,i3, v, x;
    assert( nVars >= 6 && nVars <= 10 );
    // start arrays
    for ( i = 0; i < nVars; i++ )
    {
        assert( If_Dec10HasVar( pF, nVars, i ) );
        Pla2Var[i] = Var2Pla[i] = i;
    }
/*
    Cnt++;
//if ( Cnt == 108 )
{
printf( "%d\n", Cnt );
//Extra_PrintHex( stdout, (unsigned *)pF, nVars );
//printf( "\n" ); 
Kit_DsdPrintFromTruth( (unsigned *)pF, nVars );
printf( "\n" );
printf( "\n" );
}
*/
    // generate permutations
    v = 0;
    for ( i0 = 0;    i0 < nVars; i0++ )
    for ( i1 = i0+1; i1 < nVars; i1++ )
    for ( i2 = i1+1; i2 < nVars; i2++ )
    for ( i3 = i2+1; i3 < nVars; i3++, v++ )
    {
        If_Dec10MoveTo( pF, nVars, i0, nVars-1, Pla2Var, Var2Pla );
        If_Dec10MoveTo( pF, nVars, i1, nVars-2, Pla2Var, Var2Pla );
        If_Dec10MoveTo( pF, nVars, i2, nVars-3, Pla2Var, Var2Pla );
        If_Dec10MoveTo( pF, nVars, i3, nVars-4, Pla2Var, Var2Pla );
        If_DecVerifyPerm( Pla2Var, Var2Pla, nVars );
        Count[v] = If_Dec10CofCount( pF, nVars );
        Masks[v] = (1 << i0) | (1 << i1) | (1 << i2) | (1 << i3);
        assert( Count[v] > 1 );
//printf( "%d ", Count[v] );
        if ( Count[v] == 2 || Count[v] > 5 )
            continue;
        for ( x = 0; x < 4; x++ )
        {
            If_Dec10Cofactors( pF, nVars, nVars-1-x, pCof0, pCof1 );
            if ( If_Dec10CofCount2(pCof0, nVars) <= 2 && If_Dec10CofCount2(pCof1, nVars) <= 2 )
            {
                Count[v] = -Count[v];
                break;
            }
        }
    }
//printf( "\n" );
    assert( v <= 210 );
    // check if there are compatible bound sets
    for ( i0 = 0; i0 < v; i0++ )
    for ( i1 = i0+1; i1 < v; i1++ )
    {
        if ( If_Dec10Count16(Masks[i0] & Masks[i1]) > 10 - nVars )
            continue;
        if ( nVars == 10 )
        {
            if ( Count[i0] == 2 && Count[i1] == 2 )
                return 1;
        }
        else if ( nVars == 9 )
        {
            if ( (Count[i0] == 2 && Count[i1] == 2) || 
                 (Count[i0] == 2 && Count[i1] <  0) || 
                 (Count[i0] <  0 && Count[i1] == 2) )
                return 1;
        }
        else
        {
            if ( (Count[i0] == 2 && Count[i1] == 2) || 
                 (Count[i0] == 2 && Count[i1] <  0) || 
                 (Count[i0] <  0 && Count[i1] == 2) || 
                 (Count[i0] <  0 && Count[i1] <  0) )
                return 1;
        }
    }
//    printf( "not found\n" );
    return 0;
}